

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
          (CodedOutputStream *this,string_view str,uint8_t *target)

{
  ulong uVar1;
  Nonnull<const_char_*> pcVar2;
  uint uVar3;
  byte *pbVar4;
  
  pbVar4 = (byte *)str._M_str;
  if ((ulong)this >> 0x20 == 0) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,long>
                       ((unsigned_long)this,0xffffffff,
                        "str.size() <= std::numeric_limits<uint32_t>::max()");
  }
  if (pcVar2 != (Nonnull<const_char_*>)0x0) {
    WriteStringWithSizeToArray();
  }
  if ((uint)this < 0x80) {
    uVar1 = (ulong)this & 0xffffffff;
  }
  else {
    uVar1 = (ulong)this & 0xffffffff;
    do {
      uVar3 = (uint)uVar1;
      *pbVar4 = (byte)uVar1 | 0x80;
      uVar1 = uVar1 >> 7;
      pbVar4 = pbVar4 + 1;
    } while (0x3fff < uVar3);
  }
  *pbVar4 = (byte)uVar1;
  memcpy(pbVar4 + 1,(void *)str._M_len,(ulong)this & 0xffffffff);
  return pbVar4 + (long)(int)(uint)this + 1;
}

Assistant:

uint8_t* CodedOutputStream::WriteStringWithSizeToArray(absl::string_view str,
                                                       uint8_t* target) {
  ABSL_DCHECK_LE(str.size(), std::numeric_limits<uint32_t>::max());
  target = WriteVarint32ToArray(str.size(), target);
  return WriteStringToArray(str, target);
}